

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdReplace<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,unsigned_int>
          (Thread *this,Instr instr)

{
  undefined1 local_24 [8];
  Simd<unsigned_char,_(unsigned_char)__x10_> simd;
  uint val;
  Thread *this_local;
  
  unique0x1000008b = this;
  simd.v._8_4_ = Pop<unsigned_int>(this);
  _local_24 = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  local_24[instr.field_2.imm_u8] = simd.v[8];
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,_local_24);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdReplace(Instr instr) {
  auto val = Pop<T>();
  auto simd = Pop<R>();
  simd.v[instr.imm_u8] = val;
  Push(simd);
  return RunResult::Ok;
}